

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_node_scalar_sol(REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  REF_NODE ref_node_00;
  REF_MPI pRVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT dim;
  REF_INT version;
  REF_INT i;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  FILE *file_local;
  REF_DBL *scalar_local;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  pRVar1 = ref_grid->mpi;
  ref_grid_local._4_4_ = ref_node_synchronize_globals(ref_node_00);
  if (ref_grid_local._4_4_ == 0) {
    ref_private_macro_code_rss_1 = 3;
    if (ref_grid->twod != 0) {
      ref_private_macro_code_rss_1 = 2;
    }
    if (pRVar1->id == 0) {
      fprintf((FILE *)file,"MeshVersionFormatted %d\n\n",2);
      fprintf((FILE *)file,"Dimension %d\n\n",(ulong)(uint)ref_private_macro_code_rss_1);
    }
    if (pRVar1->id == 0) {
      fprintf((FILE *)file,"SolAtVertices\n");
      fprintf((FILE *)file,"%ld\n",ref_node_00->old_n_global);
      fprintf((FILE *)file,"%d",(ulong)(uint)ldim);
      for (dim = 0; dim < ldim; dim = dim + 1) {
        fprintf((FILE *)file," %d",1);
      }
      fprintf((FILE *)file,"\n");
    }
    ref_grid_local._4_4_ = ref_gather_node_scalar_txt(ref_node_00,ldim,scalar," ",0,file);
    if (ref_grid_local._4_4_ == 0) {
      if (pRVar1->id == 0) {
        fprintf((FILE *)file,"\nEnd\n");
      }
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x77f,"ref_gather_node_scalar_sol",(ulong)ref_grid_local._4_4_,"txt dump in solb");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x768,
           "ref_gather_node_scalar_sol",(ulong)ref_grid_local._4_4_,"sync");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_scalar_sol(REF_GRID ref_grid,
                                                     REF_INT ldim,
                                                     REF_DBL *scalar,
                                                     FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT i;
  REF_INT version, dim;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  dim = 3;
  if (ref_grid_twod(ref_grid)) dim = 2;

  version = 2;

  if (ref_mpi_once(ref_mpi)) {
    fprintf(file, "MeshVersionFormatted %d\n\n", version);
    fprintf(file, "Dimension %d\n\n", dim);
  }

  if (ref_mpi_once(ref_mpi)) {
    fprintf(file, "SolAtVertices\n");
    fprintf(file, REF_GLOB_FMT "\n", ref_node_n_global(ref_node));
    fprintf(file, "%d", ldim);
    for (i = 0; i < ldim; i++) {
      fprintf(file, " %d", 1);
    }
    fprintf(file, "\n");
  }

  RSS(ref_gather_node_scalar_txt(ref_node, ldim, scalar, " ", REF_FALSE, file),
      "txt dump in solb");

  if (ref_mpi_once(ref_mpi)) { /* End */
    fprintf(file, "\nEnd\n");
  }

  return REF_SUCCESS;
}